

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_VaryingLengths::_Run(_Test_VaryingLengths *this)

{
  double dVar1;
  uint uVar2;
  bool b;
  int iVar3;
  Tester *pTVar4;
  int i;
  char acVar5 [4];
  uint local_1fc;
  double local_1f8;
  uint local_1f0;
  uint local_1ec;
  int mediocre_filters;
  char buffer [4];
  double rate;
  size_t local_1d8;
  char *local_1d0;
  char *local_1c8;
  
  mediocre_filters = 0;
  local_1f0 = 0;
  local_1ec = 0;
  for (local_1fc = 1; uVar2 = local_1ec, (int)local_1fc < 0x2711; local_1fc = iVar3 + local_1fc) {
    BloomTest::Reset(&this->super_BloomTest);
    acVar5[0] = '\0';
    acVar5[1] = '\0';
    acVar5[2] = '\0';
    acVar5[3] = '\0';
    for (; (int)acVar5 < (int)local_1fc; acVar5 = (char  [4])((int)acVar5 + 1)) {
      local_1c8 = (char *)0x4;
      buffer = acVar5;
      local_1d0 = buffer;
      BloomTest::Add(&this->super_BloomTest,(Slice *)&local_1d0);
    }
    BloomTest::Build(&this->super_BloomTest);
    test::Tester::Tester
              ((Tester *)&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/bloom_test.cc"
               ,0x7c);
    rate = (double)(this->super_BloomTest).filter_._M_string_length;
    local_1f8 = (double)(long)((int)(local_1fc * 10) / 8 + 0x28);
    pTVar4 = test::Tester::IsLe<unsigned_long,unsigned_long>
                       ((Tester *)&local_1d0,(unsigned_long *)&rate,(unsigned_long *)&local_1f8);
    test::Tester::operator<<(pTVar4,(int *)&local_1fc);
    test::Tester::~Tester((Tester *)&local_1d0);
    iVar3 = 0;
    while (local_1f8 = (double)CONCAT44(local_1f8._4_4_,iVar3), iVar3 < (int)local_1fc) {
      test::Tester::Tester
                ((Tester *)&local_1d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/bloom_test.cc"
                 ,0x81);
      dVar1 = local_1f8;
      buffer[0] = local_1f8._0_1_;
      buffer[1] = local_1f8._1_1_;
      buffer[2] = local_1f8._2_1_;
      buffer[3] = local_1f8._3_1_;
      local_1d8 = 4;
      local_1f8 = dVar1;
      rate = (double)buffer;
      b = BloomTest::Matches(&this->super_BloomTest,(Slice *)&rate);
      pTVar4 = test::Tester::Is((Tester *)&local_1d0,b,"Matches(Key(i, buffer))");
      pTVar4 = test::Tester::operator<<(pTVar4,(char (*) [8])"Length ");
      pTVar4 = test::Tester::operator<<(pTVar4,(int *)&local_1fc);
      pTVar4 = test::Tester::operator<<(pTVar4,(char (*) [7])"; key ");
      test::Tester::operator<<(pTVar4,(int *)&local_1f8);
      test::Tester::~Tester((Tester *)&local_1d0);
      iVar3 = (int)local_1f8._0_4_ + 1;
    }
    rate = BloomTest::FalsePositiveRate(&this->super_BloomTest);
    fprintf(_stderr,"False positives: %5.2f%% @ length = %6d ; bytes = %6d\n",rate * 100.0,
            (ulong)local_1fc,(ulong)(uint)(this->super_BloomTest).filter_._M_string_length);
    test::Tester::Tester
              ((Tester *)&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/bloom_test.cc"
               ,0x8b);
    local_1f8 = 0.02;
    test::Tester::IsLe<double,double>((Tester *)&local_1d0,&rate,&local_1f8);
    test::Tester::~Tester((Tester *)&local_1d0);
    if (rate <= 0.0125) {
      local_1ec = local_1ec + 1;
    }
    else {
      local_1f0 = local_1f0 + 1;
      mediocre_filters = local_1f0;
    }
    iVar3 = 1;
    if (9 < (int)local_1fc) {
      iVar3 = 10;
      if (99 < local_1fc) {
        iVar3 = 1000;
        if (local_1fc < 1000) {
          iVar3 = 100;
        }
      }
    }
  }
  fprintf(_stderr,"Filters: %d good, %d mediocre\n",(ulong)local_1ec,(ulong)local_1f0);
  test::Tester::Tester
            ((Tester *)&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/bloom_test.cc"
             ,0x95);
  rate = (double)CONCAT44(rate._4_4_,(int)uVar2 / 5);
  test::Tester::IsLe<int,int>((Tester *)&local_1d0,&mediocre_filters,(int *)&rate);
  test::Tester::~Tester((Tester *)&local_1d0);
  return;
}

Assistant:

TEST(BloomTest, VaryingLengths) {
  char buffer[sizeof(int)];

  // Count number of filters that significantly exceed the false positive rate
  int mediocre_filters = 0;
  int good_filters = 0;

  for (int length = 1; length <= 10000; length = NextLength(length)) {
    Reset();
    for (int i = 0; i < length; i++) {
      Add(Key(i, buffer));
    }
    Build();

    ASSERT_LE(FilterSize(), static_cast<size_t>((length * 10 / 8) + 40))
        << length;

    // All added keys must match
    for (int i = 0; i < length; i++) {
      ASSERT_TRUE(Matches(Key(i, buffer)))
          << "Length " << length << "; key " << i;
    }

    // Check false positive rate
    double rate = FalsePositiveRate();
    if (kVerbose >= 1) {
      fprintf(stderr, "False positives: %5.2f%% @ length = %6d ; bytes = %6d\n",
              rate * 100.0, length, static_cast<int>(FilterSize()));
    }
    ASSERT_LE(rate, 0.02);  // Must not be over 2%
    if (rate > 0.0125)
      mediocre_filters++;  // Allowed, but not too often
    else
      good_filters++;
  }
  if (kVerbose >= 1) {
    fprintf(stderr, "Filters: %d good, %d mediocre\n", good_filters,
            mediocre_filters);
  }
  ASSERT_LE(mediocre_filters, good_filters / 5);
}